

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

void __thiscall
crnlib::dxt_image::set_block_pixels
          (dxt_image *this,uint block_x,uint block_y,color_quad_u8 *pPixels,pack_params *p,
          set_block_pixels_context *context)

{
  char cVar1;
  element_type eVar2;
  byte bVar3;
  bool bVar4;
  color_quad<unsigned_char,_int> *local_228;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_21c;
  crn_etc_quality local_218;
  int local_214;
  etc1_quality local_210;
  uint local_20c;
  uint local_1fc;
  uint i_5;
  dxt3_block *pDXT3_block_1;
  int comp_index_1;
  uint i_4;
  params params_1;
  uint8 selectors_1 [16];
  results results_1;
  dxt5_block *pDXT5_block_1;
  undefined1 local_190 [4];
  uint i_3;
  params params;
  uint8 selectors [16];
  undefined1 local_150 [8];
  results results;
  uint i_2;
  bool pixels_have_alpha;
  dxt1_block *pDXT1_block_1;
  uint element_index_3;
  dxt5_endpoint_optimizer *dxt5_optimizer;
  dxt1_endpoint_optimizer *dxt1_optimizer;
  uint i_1;
  dxt3_block *pDXT3_block;
  int comp_index;
  dxt5_block *pDXT5_block;
  dxt1_block *pDXT1_block;
  uint element_index_2;
  uint i;
  color_quad_u8 pixels [16];
  crn_etc1_pack_params pack_params_6;
  etc2a_pack_params pack_params_5;
  uint element_index_1;
  crn_etc1_pack_params pack_params_4;
  etc1_pack_params pack_params_3;
  etc2a_pack_params pack_params_2;
  uint element_index;
  etc1_quality etc_quality_1;
  etc1_pack_params pack_params_1;
  etc1_block *dst_block_1;
  byte local_48;
  etc1_pack_params pack_params;
  etc1_quality etc_quality;
  etc1_block *dst_block;
  element *pElement;
  set_block_pixels_context *context_local;
  pack_params *p_local;
  color_quad_u8 *pPixels_local;
  uint block_y_local;
  uint block_x_local;
  dxt_image *this_local;
  
  dst_block = (etc1_block *)get_element(this,block_x,block_y,0);
  if (this->m_format == cETC1) {
    pack_params.m_quality = cHighQuality;
    if (p->m_quality < cCRNDXTQualityNormal) {
      pack_params.m_quality = cLowQuality;
    }
    else if (p->m_quality < cCRNDXTQualityBetter) {
      pack_params.m_quality = cMediumQuality;
    }
    unique0x100009ae = (etc1_pack_params)dst_block;
    rg_etc1::etc1_pack_params::etc1_pack_params((etc1_pack_params *)((long)&dst_block_1 + 4));
    local_48 = p->m_dithering & 1;
    dst_block_1._4_4_ = pack_params.m_quality;
    rg_etc1::pack_etc1_block
              ((void *)stack0xffffffffffffffc0,(uint *)pPixels,
               (etc1_pack_params *)((long)&dst_block_1 + 4));
  }
  else if (this->m_format == cETC2) {
    pack_params_1 = (etc1_pack_params)dst_block;
    rg_etc1::etc1_pack_params::etc1_pack_params((etc1_pack_params *)&element_index);
    etc_quality_1._0_1_ = p->m_dithering & cMediumQuality;
    if (p->m_quality < cCRNDXTQualityNormal) {
      local_20c = 0;
    }
    else {
      local_20c = 2;
      if (p->m_quality < cCRNDXTQualityBetter) {
        local_20c = 1;
      }
    }
    element_index = local_20c;
    rg_etc1::pack_etc1_block
              ((void *)pack_params_1,(uint *)pPixels,(etc1_pack_params *)&element_index);
  }
  else if (this->m_format == cETC2A) {
    if (p->m_quality < cCRNDXTQualityNormal) {
      local_210 = cLowQuality;
    }
    else {
      local_210 = cHighQuality;
      if (p->m_quality < cCRNDXTQualityBetter) {
        local_210 = cMediumQuality;
      }
    }
    for (pack_params_2.m_quality = cLowQuality;
        pack_params_2.m_quality < this->m_num_elements_per_block;
        pack_params_2.m_quality = pack_params_2.m_quality + cMediumQuality) {
      if (this->m_element_type[pack_params_2.m_quality] == cAlphaETC2) {
        rg_etc1::etc2a_pack_params::etc2a_pack_params((etc2a_pack_params *)&pack_params_3);
        pack_params_3.m_quality = local_210;
        pack_params_3._4_4_ = SEXT14(this->m_element_component_index[pack_params_2.m_quality]);
        rg_etc1::pack_etc2_alpha(dst_block,(uint *)pPixels,(etc2a_pack_params *)&pack_params_3);
      }
      else {
        rg_etc1::etc1_pack_params::etc1_pack_params((etc1_pack_params *)&pack_params_4);
        pack_params_4.m_perceptual = (bool)(p->m_dithering & 1);
        pack_params_4.m_quality = local_210;
        rg_etc1::pack_etc1_block(dst_block,(uint *)pPixels,(etc1_pack_params *)&pack_params_4);
      }
      dst_block = (etc1_block *)dst_block->m_low_color;
    }
  }
  else if (this->m_format == cETC1S) {
    crn_etc1_pack_params::crn_etc1_pack_params((crn_etc1_pack_params *)&pack_params_5.comp_index);
    if (p->m_quality < cCRNDXTQualityNormal) {
      local_214 = 0;
    }
    else {
      local_214 = 2;
      if (p->m_quality < cCRNDXTQualityBetter) {
        local_214 = 1;
      }
    }
    pack_params_5.comp_index = local_214;
    pack_etc1s_block(dst_block,pPixels,(crn_etc1_pack_params *)&pack_params_5.comp_index);
  }
  else if (this->m_format == cETC2AS) {
    for (pack_params_5.m_quality = cLowQuality;
        pack_params_5.m_quality < this->m_num_elements_per_block;
        pack_params_5.m_quality = pack_params_5.m_quality + cMediumQuality) {
      if (this->m_element_type[pack_params_5.m_quality] == cAlphaETC2) {
        rg_etc1::etc2a_pack_params::etc2a_pack_params((etc2a_pack_params *)&pack_params_6);
        if (p->m_quality < cCRNDXTQualityNormal) {
          local_218 = cCRNETCQualityFast;
        }
        else {
          local_218 = cCRNETCQualitySlow;
          if (p->m_quality < cCRNDXTQualityBetter) {
            local_218 = cCRNETCQualityMedium;
          }
        }
        pack_params_6.m_quality = local_218;
        pack_params_6._4_4_ = SEXT14(this->m_element_component_index[pack_params_5.m_quality]);
        rg_etc1::pack_etc2_alpha(dst_block,(uint *)pPixels,(etc2a_pack_params *)&pack_params_6);
      }
      else {
        crn_etc1_pack_params::crn_etc1_pack_params((crn_etc1_pack_params *)(pixels + 0xf));
        if (p->m_quality < cCRNDXTQualityNormal) {
          local_21c.m_u32 = 0;
        }
        else {
          local_21c.m_u32 = 2;
          if (p->m_quality < cCRNDXTQualityBetter) {
            local_21c.m_u32 = 1;
          }
        }
        pixels[0xf].field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)local_21c.field_0;
        pack_etc1s_block(dst_block,pPixels,(crn_etc1_pack_params *)(pixels + 0xf));
      }
      dst_block = (etc1_block *)dst_block->m_low_color;
    }
  }
  else if ((p->m_compressor == cCRNDXTCompressorRYG) &&
          (((this->m_format == cDXT1 || (this->m_format == cDXT5)) || (this->m_format == cDXT5A))))
  {
    local_228 = (color_quad<unsigned_char,_int> *)&element_index_2;
    do {
      color_quad<unsigned_char,_int>::color_quad(local_228);
      local_228 = local_228 + 1;
    } while (local_228 != pixels + 0xe);
    for (pDXT1_block._4_4_ = 0; pDXT1_block._4_4_ < 0x10; pDXT1_block._4_4_ = pDXT1_block._4_4_ + 1)
    {
      *(uchar *)(&element_index_2 + pDXT1_block._4_4_) =
           pPixels[pDXT1_block._4_4_].field_0.field_0.b;
      *(uchar *)((long)&element_index_2 + (ulong)pDXT1_block._4_4_ * 4 + 1) =
           pPixels[pDXT1_block._4_4_].field_0.field_0.g;
      *(uchar *)((long)&element_index_2 + (ulong)pDXT1_block._4_4_ * 4 + 2) =
           pPixels[pDXT1_block._4_4_].field_0.field_0.r;
      if (this->m_format == cDXT1) {
        *(undefined1 *)((long)&element_index_2 + (ulong)pDXT1_block._4_4_ * 4 + 3) = 0xff;
      }
      else {
        *(uchar *)((long)&element_index_2 + (ulong)pDXT1_block._4_4_ * 4 + 3) =
             pPixels[pDXT1_block._4_4_].field_0.field_0.a;
      }
    }
    if (this->m_format == cDXT5A) {
      ryg_dxt::sCompressDXT5ABlock((sU8 *)dst_block,&element_index_2);
    }
    else {
      ryg_dxt::sCompressDXTBlock((sU8 *)dst_block,&element_index_2,this->m_format == cDXT5,0);
    }
  }
  else if ((p->m_compressor == cCRNDXTCompressorCRNF) && (this->m_format != cDXT1A)) {
    for (pDXT1_block._0_4_ = 0; (uint)pDXT1_block < this->m_num_elements_per_block;
        pDXT1_block._0_4_ = (uint)pDXT1_block + 1) {
      eVar2 = this->m_element_type[(uint)pDXT1_block];
      if (eVar2 == cColorDXT1) {
        dxt_fast::compress_color_block
                  ((dxt1_block *)dst_block,pPixels,cCRNDXTQualityFast < p->m_quality);
      }
      else if (eVar2 == cAlphaDXT3) {
        cVar1 = this->m_element_component_index[(uint)pDXT1_block];
        for (dxt1_optimizer._4_4_ = 0; dxt1_optimizer._4_4_ < 0x10;
            dxt1_optimizer._4_4_ = dxt1_optimizer._4_4_ + 1) {
          bVar3 = color_quad<unsigned_char,_int>::operator[]
                            (pPixels + dxt1_optimizer._4_4_,(int)cVar1);
          dxt3_block::set_alpha
                    ((dxt3_block *)dst_block,dxt1_optimizer._4_4_ & 3,dxt1_optimizer._4_4_ >> 2,
                     (uint)bVar3,true);
        }
      }
      else if (eVar2 == cAlphaDXT5) {
        dxt_fast::compress_alpha_block
                  ((dxt5_block *)dst_block,pPixels,
                   (int)this->m_element_component_index[(uint)pDXT1_block]);
      }
      dst_block = (etc1_block *)dst_block->m_low_color;
    }
  }
  else {
    for (pDXT1_block_1._4_4_ = 0; pDXT1_block_1._4_4_ < this->m_num_elements_per_block;
        pDXT1_block_1._4_4_ = pDXT1_block_1._4_4_ + 1) {
      eVar2 = this->m_element_type[pDXT1_block_1._4_4_];
      if (eVar2 == cColorDXT1) {
        results._31_1_ = 0;
        if (this->m_format == cDXT1A) {
          results.m_alpha_block = false;
          results.m_reordered = false;
          results.m_alternate_rounding = false;
          results.m_enforce_selector = false;
          for (; (uint)results._24_4_ < 0x10; results._24_4_ = results._24_4_ + 1) {
            if ((uint)pPixels[(uint)results._24_4_].field_0.field_0.a < p->m_dxt1a_alpha_threshold)
            {
              results._31_1_ = 1;
              break;
            }
          }
        }
        dxt1_endpoint_optimizer::results::results((results *)local_150);
        results._8_8_ = &params.m_endpoint_caching;
        dxt1_endpoint_optimizer::params::params((params *)local_190);
        local_190 = (undefined1  [4])(block_x + block_y * this->m_blocks_x);
        params.m_num_pixels = p->m_quality;
        params.m_dxt1a_alpha_threshold._2_1_ = p->m_perceptual & 1;
        params.m_dxt1a_alpha_threshold._3_1_ = p->m_grayscale_sampling & 1;
        params.m_dxt1a_alpha_threshold._0_1_ = results._31_1_ & 1;
        params.m_dxt1a_alpha_threshold._1_1_ = p->m_use_both_block_types & 1;
        params.m_quality._1_1_ = p->m_use_transparent_indices_for_black & 1;
        params.m_pPixels._4_4_ = p->m_dxt1a_alpha_threshold;
        params.m_pPixels._0_4_ = 0x10;
        params.m_quality._0_1_ = p->m_endpoint_caching & cCRNDXTQualityFast;
        if ((this->m_format != cDXT1) && (this->m_format != cDXT1A)) {
          params.m_dxt1a_alpha_threshold._1_1_ = 0;
        }
        params._0_8_ = pPixels;
        bVar4 = dxt1_endpoint_optimizer::compute
                          (&context->m_dxt1_optimizer,(params *)local_190,(results *)local_150);
        if (bVar4) {
          dxt1_block::set_low_color((dxt1_block *)dst_block,(uint16)results.m_error);
          dxt1_block::set_high_color((dxt1_block *)dst_block,results.m_error._2_2_);
          for (pDXT5_block_1._4_4_ = 0; pDXT5_block_1._4_4_ < 0x10;
              pDXT5_block_1._4_4_ = pDXT5_block_1._4_4_ + 1) {
            dxt1_block::set_selector
                      ((dxt1_block *)dst_block,pDXT5_block_1._4_4_ & 3,pDXT5_block_1._4_4_ >> 2,
                       (uint)selectors[(ulong)pDXT5_block_1._4_4_ - 8]);
          }
        }
      }
      else if (eVar2 == cAlphaDXT3) {
        cVar1 = this->m_element_component_index[pDXT1_block_1._4_4_];
        for (local_1fc = 0; local_1fc < 0x10; local_1fc = local_1fc + 1) {
          bVar3 = color_quad<unsigned_char,_int>::operator[](pPixels + local_1fc,(int)cVar1);
          dxt3_block::set_alpha
                    ((dxt3_block *)dst_block,local_1fc & 3,local_1fc >> 2,(uint)bVar3,true);
        }
      }
      else if (eVar2 == cAlphaDXT5) {
        selectors_1._8_8_ = &params_1.m_quality;
        dxt5_endpoint_optimizer::params::params((params *)&comp_index_1);
        comp_index_1 = block_x + block_y * this->m_blocks_x;
        params_1.m_pPixels._0_4_ = 0x10;
        params_1.m_pPixels._4_4_ = (int)this->m_element_component_index[pDXT1_block_1._4_4_];
        params_1.m_num_pixels = p->m_quality;
        params_1.m_comp_index._0_1_ = p->m_use_both_block_types & 1;
        params_1._0_8_ = pPixels;
        bVar4 = dxt5_endpoint_optimizer::compute
                          (&context->m_dxt5_optimizer,(params *)&comp_index_1,
                           (results *)(selectors_1 + 8));
        if (bVar4) {
          dxt5_block::set_low_alpha((dxt5_block *)dst_block,(uint)(byte)results_1.m_error);
          dxt5_block::set_high_alpha((dxt5_block *)dst_block,(uint)results_1.m_error._1_1_);
          for (pDXT3_block_1._4_4_ = 0; pDXT3_block_1._4_4_ < 0x10;
              pDXT3_block_1._4_4_ = pDXT3_block_1._4_4_ + 1) {
            dxt5_block::set_selector
                      ((dxt5_block *)dst_block,pDXT3_block_1._4_4_ & 3,pDXT3_block_1._4_4_ >> 2,
                       (uint)selectors_1[(ulong)pDXT3_block_1._4_4_ - 8]);
          }
        }
      }
      dst_block = (etc1_block *)dst_block->m_low_color;
    }
  }
  return;
}

Assistant:

void dxt_image::set_block_pixels(
        uint block_x, uint block_y, const color_quad_u8* pPixels, const pack_params& p,
        set_block_pixels_context& context)
    {
        element* pElement = &get_element(block_x, block_y, 0);

        if (m_format == cETC1)
        {
            etc1_block& dst_block = *reinterpret_cast<etc1_block*>(pElement);

#if CRNLIB_USE_RG_ETC1
            rg_etc1::etc1_quality etc_quality = rg_etc1::cHighQuality;
            if (p.m_quality <= cCRNDXTQualityFast)
            {
                etc_quality = rg_etc1::cLowQuality;
            }
            else if (p.m_quality <= cCRNDXTQualityNormal)
            {
                etc_quality = rg_etc1::cMediumQuality;
            }

            rg_etc1::etc1_pack_params pack_params;
            pack_params.m_dithering = p.m_dithering;
            //pack_params.m_perceptual = p.m_perceptual;
            pack_params.m_quality = etc_quality;
            rg_etc1::pack_etc1_block(&dst_block, (uint32*)pPixels, pack_params);
#else
            crn_etc_quality etc_quality = cCRNETCQualitySlow;
            if (p.m_quality <= cCRNDXTQualityFast)
                etc_quality = cCRNETCQualityFast;
            else if (p.m_quality <= cCRNDXTQualityNormal)
                etc_quality = cCRNETCQualityMedium;

            crn_etc1_pack_params pack_params;
            pack_params.m_perceptual = p.m_perceptual;
            pack_params.m_quality = etc_quality;
            pack_params.m_dithering = p.m_dithering;

            pack_etc1_block(dst_block, pPixels, pack_params, context.m_etc1_optimizer);
#endif
        }
        else if (m_format == cETC2)
        {
            etc1_block& dst_block = *reinterpret_cast<etc1_block*>(pElement);
            rg_etc1::etc1_pack_params pack_params;
            pack_params.m_dithering = p.m_dithering;
            pack_params.m_quality = p.m_quality <= cCRNDXTQualityFast ? rg_etc1::cLowQuality : p.m_quality <= cCRNDXTQualityNormal ? rg_etc1::cMediumQuality
                                                                                                                                   : rg_etc1::cHighQuality;
            rg_etc1::pack_etc1_block(&dst_block, (uint32*)pPixels, pack_params);
        }
        else if (m_format == cETC2A)
        {
            rg_etc1::etc1_quality etc_quality = p.m_quality <= cCRNDXTQualityFast ? rg_etc1::cLowQuality : p.m_quality <= cCRNDXTQualityNormal ? rg_etc1::cMediumQuality
                                                                                                                                               : rg_etc1::cHighQuality;
            for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
            {
                if (m_element_type[element_index] == cAlphaETC2)
                {
                    rg_etc1::etc2a_pack_params pack_params;
                    pack_params.m_quality = etc_quality;
                    pack_params.comp_index = m_element_component_index[element_index];
                    rg_etc1::pack_etc2_alpha(pElement, (uint32*)pPixels, pack_params);
                }
                else
                {
                    rg_etc1::etc1_pack_params pack_params;
                    pack_params.m_dithering = p.m_dithering;
                    pack_params.m_quality = etc_quality;
                    rg_etc1::pack_etc1_block(pElement, (uint32*)pPixels, pack_params);
                }
            }
        }
        else if (m_format == cETC1S)
        {
            crn_etc1_pack_params pack_params;
            pack_params.m_perceptual = p.m_perceptual;
            pack_params.m_dithering = p.m_dithering;
            pack_params.m_quality = p.m_quality <= cCRNDXTQualityFast ? cCRNETCQualityFast : p.m_quality <= cCRNDXTQualityNormal ? cCRNETCQualityMedium
                                                                                                                                 : cCRNETCQualitySlow;
            pack_etc1s_block(*(etc1_block*)pElement, pPixels, pack_params);
        }
        else if (m_format == cETC2AS)
        {
            for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
            {
                if (m_element_type[element_index] == cAlphaETC2)
                {
                    rg_etc1::etc2a_pack_params pack_params;
                    pack_params.m_quality = p.m_quality <= cCRNDXTQualityFast ? rg_etc1::cLowQuality : p.m_quality <= cCRNDXTQualityNormal ? rg_etc1::cMediumQuality
                                                                                                                                           : rg_etc1::cHighQuality;
                    pack_params.comp_index = m_element_component_index[element_index];
                    rg_etc1::pack_etc2_alpha(pElement, (uint32*)pPixels, pack_params);
                }
                else
                {
                    crn_etc1_pack_params pack_params;
                    pack_params.m_perceptual = p.m_perceptual;
                    pack_params.m_dithering = p.m_dithering;
                    pack_params.m_quality = p.m_quality <= cCRNDXTQualityFast ? cCRNETCQualityFast : p.m_quality <= cCRNDXTQualityNormal ? cCRNETCQualityMedium
                                                                                                                                         : cCRNETCQualitySlow;
                    pack_etc1s_block(*(etc1_block*)pElement, pPixels, pack_params);
                }
            }
        }
        else
#if CRNLIB_SUPPORT_SQUISH
            if ((p.m_compressor == cCRNDXTCompressorSquish) && ((m_format == cDXT1) || (m_format == cDXT1A) || (m_format == cDXT3) || (m_format == cDXT5) || (m_format == cDXT5A)))
        {
            uint squish_flags = 0;
            if ((m_format == cDXT1) || (m_format == cDXT1A))
                squish_flags = squish::kDxt1;
            else if (m_format == cDXT3)
                squish_flags = squish::kDxt3;
            else if (m_format == cDXT5A)
                squish_flags = squish::kDxt5A;
            else
                squish_flags = squish::kDxt5;

            if (p.m_perceptual)
                squish_flags |= squish::kColourMetricPerceptual;
            else
                squish_flags |= squish::kColourMetricUniform;

            if (p.m_quality >= cCRNDXTQualityBetter)
                squish_flags |= squish::kColourIterativeClusterFit;
            else if (p.m_quality == cCRNDXTQualitySuperFast)
                squish_flags |= squish::kColourRangeFit;

            color_quad_u8 pixels[cDXTBlockSize * cDXTBlockSize];

            memcpy(pixels, pPixels, sizeof(color_quad_u8) * cDXTBlockSize * cDXTBlockSize);

            if (m_format == cDXT1)
            {
                for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    pixels[i].a = 255;
            }
            else if (m_format == cDXT1A)
            {
                for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    if (pixels[i].a < p.m_dxt1a_alpha_threshold)
                        pixels[i].a = 0;
                    else
                        pixels[i].a = 255;
            }

            squish::Compress(reinterpret_cast<const squish::u8*>(pixels), pElement, squish_flags);
        }

        else
#endif // CRNLIB_SUPPORT_SQUISH \
    // RYG doesn't support DXT1A
            if ((p.m_compressor == cCRNDXTCompressorRYG) && ((m_format == cDXT1) || (m_format == cDXT5) || (m_format == cDXT5A)))
        {
            color_quad_u8 pixels[cDXTBlockSize * cDXTBlockSize];

            for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
            {
                pixels[i].r = pPixels[i].b;
                pixels[i].g = pPixels[i].g;
                pixels[i].b = pPixels[i].r;

                if (m_format != cDXT1)
                {
                    pixels[i].a = pPixels[i].a;
                }
                else
                {
                    pixels[i].a = 255;
                }
            }

            if (m_format == cDXT5A)
            {
                ryg_dxt::sCompressDXT5ABlock((sU8*)pElement, (const sU32*)pixels);
            }
            else
            {
                ryg_dxt::sCompressDXTBlock((sU8*)pElement, (const sU32*)pixels, m_format == cDXT5, 0);
            }
        }
        else if ((p.m_compressor == cCRNDXTCompressorCRNF) && (m_format != cDXT1A))
        {
            for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
            {
                switch (m_element_type[element_index])
                {
                case cColorDXT1:
                {
                    dxt1_block* pDXT1_block = reinterpret_cast<dxt1_block*>(pElement);
                    dxt_fast::compress_color_block(pDXT1_block, pPixels, p.m_quality >= cCRNDXTQualityNormal);

                    break;
                }
                case cAlphaDXT5:
                {
                    dxt5_block* pDXT5_block = reinterpret_cast<dxt5_block*>(pElement);
                    dxt_fast::compress_alpha_block(pDXT5_block, pPixels, m_element_component_index[element_index]);

                    break;
                }
                case cAlphaDXT3:
                {
                    const int comp_index = m_element_component_index[element_index];

                    dxt3_block* pDXT3_block = reinterpret_cast<dxt3_block*>(pElement);

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        pDXT3_block->set_alpha(i & 3, i >> 2, pPixels[i][comp_index], true);
                    }

                    break;
                }
                default:
                    break;
                }
            }
        }
        else
        {
            dxt1_endpoint_optimizer& dxt1_optimizer = context.m_dxt1_optimizer;
            dxt5_endpoint_optimizer& dxt5_optimizer = context.m_dxt5_optimizer;

            for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
            {
                switch (m_element_type[element_index])
                {
                case cColorDXT1:
                {
                    dxt1_block* pDXT1_block = reinterpret_cast<dxt1_block*>(pElement);

                    bool pixels_have_alpha = false;
                    if (m_format == cDXT1A)
                    {
                        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                        {
                            if (pPixels[i].a < p.m_dxt1a_alpha_threshold)
                            {
                                pixels_have_alpha = true;
                                break;
                            }
                        }
                    }

                    dxt1_endpoint_optimizer::results results;
                    uint8 selectors[cDXTBlockSize * cDXTBlockSize];
                    results.m_pSelectors = selectors;

                    dxt1_endpoint_optimizer::params params;
                    params.m_block_index = block_x + block_y * m_blocks_x;
                    params.m_quality = p.m_quality;
                    params.m_perceptual = p.m_perceptual;
                    params.m_grayscale_sampling = p.m_grayscale_sampling;
                    params.m_pixels_have_alpha = pixels_have_alpha;
                    params.m_use_alpha_blocks = p.m_use_both_block_types;
                    params.m_use_transparent_indices_for_black = p.m_use_transparent_indices_for_black;
                    params.m_dxt1a_alpha_threshold = p.m_dxt1a_alpha_threshold;
                    params.m_pPixels = pPixels;
                    params.m_num_pixels = cDXTBlockSize * cDXTBlockSize;
                    params.m_endpoint_caching = p.m_endpoint_caching;

                    if ((m_format != cDXT1) && (m_format != cDXT1A))
                    {
                        params.m_use_alpha_blocks = false;
                    }

                    if (!dxt1_optimizer.compute(params, results))
                    {
                        CRNLIB_ASSERT(0);
                        break;
                    }

                    pDXT1_block->set_low_color(results.m_low_color);
                    pDXT1_block->set_high_color(results.m_high_color);

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        pDXT1_block->set_selector(i & 3, i >> 2, selectors[i]);
                    }

                    break;
                }
                case cAlphaDXT5:
                {
                    dxt5_block* pDXT5_block = reinterpret_cast<dxt5_block*>(pElement);

                    dxt5_endpoint_optimizer::results results;

                    uint8 selectors[cDXTBlockSize * cDXTBlockSize];
                    results.m_pSelectors = selectors;

                    dxt5_endpoint_optimizer::params params;
                    params.m_block_index = block_x + block_y * m_blocks_x;
                    params.m_pPixels = pPixels;
                    params.m_num_pixels = cDXTBlockSize * cDXTBlockSize;
                    params.m_comp_index = m_element_component_index[element_index];
                    params.m_quality = p.m_quality;
                    params.m_use_both_block_types = p.m_use_both_block_types;

                    if (!dxt5_optimizer.compute(params, results))
                    {
                        CRNLIB_ASSERT(0);
                        break;
                    }

                    pDXT5_block->set_low_alpha(results.m_first_endpoint);
                    pDXT5_block->set_high_alpha(results.m_second_endpoint);

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        pDXT5_block->set_selector(i & 3, i >> 2, selectors[i]);
                    }

                    break;
                }
                case cAlphaDXT3:
                {
                    const int comp_index = m_element_component_index[element_index];

                    dxt3_block* pDXT3_block = reinterpret_cast<dxt3_block*>(pElement);

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        pDXT3_block->set_alpha(i & 3, i >> 2, pPixels[i][comp_index], true);
                    }

                    break;
                }
                default:
                    break;
                }
            }
        }
    }